

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfDeepFrameBuffer.cpp
# Opt level: O0

DeepSlice * __thiscall Imf_3_2::DeepFrameBuffer::findSlice(DeepFrameBuffer *this,string *name)

{
  DeepSlice *pDVar1;
  char *in_stack_00000108;
  DeepFrameBuffer *in_stack_00000110;
  
  std::__cxx11::string::c_str();
  pDVar1 = findSlice(in_stack_00000110,in_stack_00000108);
  return pDVar1;
}

Assistant:

const DeepSlice*
DeepFrameBuffer::findSlice (const string& name) const
{
    return findSlice (name.c_str ());
}